

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  int i;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float *outptr;
  Option opt_g;
  Mat local_c0;
  void *local_80;
  void *local_78;
  void *local_70;
  long local_68;
  void *local_60;
  Option local_58;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  uVar3 = bottom_blob->c;
  local_c0.elemsize = bottom_blob->elemsize;
  local_c0.data = bottom_blob->data;
  local_c0.refcount = bottom_blob->refcount;
  local_c0.elempack = bottom_blob->elempack;
  local_c0.allocator = bottom_blob->allocator;
  local_c0.dims = bottom_blob->dims;
  local_c0.cstep = bottom_blob->cstep;
  if (local_c0.refcount != (int *)0x0) {
    LOCK();
    *local_c0.refcount = *local_c0.refcount + 1;
    UNLOCK();
  }
  local_c0.w = iVar1;
  local_c0.h = iVar2;
  local_c0.c = uVar3;
  if (local_c0.elemsize != 1) {
    local_58.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_58.use_packing_layout = opt->use_packing_layout;
    local_58.use_shader_pack8 = opt->use_shader_pack8;
    local_58.use_image_storage = opt->use_image_storage;
    local_58.use_bf16_storage = opt->use_bf16_storage;
    local_58._37_3_ = *(undefined3 *)&opt->field_0x25;
    local_58.lightmode = opt->lightmode;
    local_58._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_58.num_threads = opt->num_threads;
    local_58.workspace_allocator = opt->workspace_allocator;
    local_58.use_winograd_convolution = opt->use_winograd_convolution;
    local_58.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_58.use_int8_inference = opt->use_int8_inference;
    local_58.use_vulkan_compute = opt->use_vulkan_compute;
    local_58.use_fp16_packed = opt->use_fp16_packed;
    local_58.use_fp16_storage = opt->use_fp16_storage;
    local_58.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_58.use_int8_storage = opt->use_int8_storage;
    local_58.blob_allocator = opt->workspace_allocator;
    quantize_float32_to_int8(bottom_blob,&local_c0,this->bottom_blob_int8_scale,&local_58);
  }
  Mat::create(top_blob,this->num_output,4,opt->blob_allocator);
  local_60 = top_blob->data;
  iVar6 = -100;
  if ((local_60 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_68 = (long)this->num_output;
    if (0 < local_68) {
      uVar12 = iVar2 * iVar1;
      local_70 = (this->weight_data).data;
      local_78 = local_c0.data;
      pvVar4 = (this->weight_data_int8_scales).data;
      iVar1 = this->bias_term;
      iVar2 = this->activation_type;
      local_80 = (this->bias_data).data;
      iVar6 = 0;
      lVar8 = 0;
      do {
        fVar13 = 0.0;
        if (0 < (int)uVar3) {
          lVar11 = (long)iVar6 + (long)local_70;
          uVar7 = 0;
          iVar5 = 0;
          pvVar9 = local_c0.data;
          do {
            if (0 < (int)uVar12) {
              uVar10 = 0;
              do {
                iVar5 = iVar5 + (int)*(char *)(lVar11 + uVar10) *
                                (int)*(char *)((long)pvVar9 + uVar10);
                uVar10 = uVar10 + 1;
              } while (uVar12 != uVar10);
            }
            uVar7 = uVar7 + 1;
            lVar11 = lVar11 + (int)uVar12;
            pvVar9 = (void *)((long)pvVar9 + local_c0.cstep * local_c0.elemsize);
          } while (uVar7 != uVar3);
          fVar13 = (float)iVar5;
        }
        fVar14 = *(float *)((long)pvVar4 + lVar8 * 4);
        fVar13 = (float)(~-(uint)(fVar14 == 0.0) &
                        (uint)(1.0 / (this->bottom_blob_int8_scale * fVar14))) * fVar13;
        if (iVar1 != 0) {
          fVar13 = fVar13 + *(float *)((long)local_80 + lVar8 * 4);
        }
        fVar14 = 0.0;
        if (0.0 <= fVar13) {
          fVar14 = fVar13;
        }
        if (iVar2 != 1) {
          fVar14 = fVar13;
        }
        *(float *)((long)local_60 + lVar8 * 4) = fVar14;
        lVar8 = lVar8 + 1;
        iVar6 = iVar6 + uVar12 * uVar3;
      } while (lVar8 != local_68);
    }
    iVar6 = 0;
  }
  if (local_c0.refcount != (int *)0x0) {
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount == 0) {
      if (local_c0.allocator == (Allocator *)0x0) {
        if (local_c0.data != (void *)0x0) {
          free(local_c0.data);
        }
      }
      else {
        (**(code **)(*(long *)local_c0.allocator + 0x18))();
      }
    }
  }
  return iVar6;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_tm = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_tm, bottom_blob_int8_scale, opt_g);
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        // channels
        for (int q=0; q<channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
            const signed char* m = bottom_blob_tm.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        if (activation_type == 1)
        {
            sumfp32 = std::max(sumfp32, 0.f);
        }

        outptr[p] = sumfp32;
    }

    return 0;
}